

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double normal_truncated_a_pdf(double x,double mu,double s,double a)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (x - mu) / s;
  dVar2 = normal_01_cdf((a - mu) / s);
  dVar1 = exp(dVar1 * -0.5 * dVar1);
  return ((dVar1 / 2.5066282746310002) / (1.0 - dVar2)) / s;
}

Assistant:

double normal_truncated_a_pdf ( double x, double mu, double s, double a )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_TRUNCATED_A_PDF evaluates the lower truncated Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    21 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double MU, S, the mean and standard deviation of the
//    parent Normal distribution.
//
//    Input, double A, the lower truncation limit.
//
//    Output, double NORMAL_TRUNCATED_A_PDF, the value of the PDF.
//
{
  double alpha;
  double alpha_cdf;
  double pdf;
  double xi;
  double xi_pdf;

  alpha = ( a - mu ) / s;
  xi = ( x - mu ) / s;

  alpha_cdf = normal_01_cdf ( alpha );
  xi_pdf = normal_01_pdf ( xi );

  pdf = xi_pdf / ( 1.0 - alpha_cdf ) / s;

  return pdf;
}